

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::LoadModel(Model *this,string *file)

{
  size_type sVar1;
  reference pvVar2;
  const_reference pvVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  map<int,_Skin,_std::less<int>,_std::allocator<std::pair<const_int,_Skin>_>_> *this_00;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_Skin>_>::value,_pair<iterator,_bool>_>
  _Var8;
  size_t i_6;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  Scene *scene;
  size_t i;
  Model gltf_model;
  undefined7 in_stack_ffffffffffff7bc0;
  undefined1 in_stack_ffffffffffff7bc7;
  _Rb_tree_iterator<std::pair<const_int,_Skin>_> in_stack_ffffffffffff7bc8;
  map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>
  *in_stack_ffffffffffff7bd0;
  key_type *in_stack_ffffffffffff7bf8;
  undefined7 in_stack_ffffffffffff7c00;
  undefined1 in_stack_ffffffffffff7c07;
  Model *in_stack_ffffffffffff7c08;
  Model *in_stack_ffffffffffff7c50;
  string *in_stack_ffffffffffff7ce8;
  Model *in_stack_ffffffffffff7cf0;
  Skin *in_stack_ffffffffffff7d30;
  Model *in_stack_ffffffffffff7d38;
  ulong local_8278;
  size_type local_81a8;
  Animation *in_stack_ffffffffffff7ea0;
  Model *in_stack_ffffffffffff7ea8;
  map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
  *in_stack_ffffffffffff7eb8;
  int in_stack_ffffffffffff7ec0;
  int in_stack_ffffffffffff7ec4;
  Node *in_stack_ffffffffffff7ec8;
  Model *in_stack_ffffffffffff7ed0;
  ulong local_8088;
  Mesh *in_stack_ffffffffffff80e0;
  Model *in_stack_ffffffffffff80e8;
  ulong uVar9;
  ulong __n;
  ulong local_7f00;
  ulong local_7ef8;
  Material *in_stack_ffffffffffff8400;
  Model *in_stack_ffffffffffff8408;
  ulong local_440;
  vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_> local_410 [3];
  vector<tinygltf::Material,_std::allocator<tinygltf::Material>_> local_3c8;
  vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_> local_3b0;
  vector<tinygltf::Node,_std::allocator<tinygltf::Node>_> local_398;
  vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_> local_380 [2];
  vector<tinygltf::Skin,_std::allocator<tinygltf::Skin>_> local_350 [3];
  vector<tinygltf::Scene,_std::allocator<tinygltf::Scene>_> avStack_308 [2];
  int local_2d8;
  
  tinygltf::Model::Model(in_stack_ffffffffffff7c50);
  LoadglTFModel(in_stack_ffffffffffff7cf0,in_stack_ffffffffffff7ce8);
  local_440 = 0;
  while( true ) {
    sVar1 = std::vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>::size(&local_3b0);
    if (sVar1 <= local_440) break;
    std::vector<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>::operator[](&local_3b0,local_440);
    LoadglTFMesh(in_stack_ffffffffffff80e8,in_stack_ffffffffffff80e0);
    std::make_pair<unsigned_long&,Mesh>
              ((unsigned_long *)in_stack_ffffffffffff7bc8._M_node,
               (Mesh *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    std::map<int,Mesh,std::less<int>,std::allocator<std::pair<int_const,Mesh>>>::
    insert<std::pair<unsigned_long,Mesh>>
              (in_stack_ffffffffffff7bd0,
               (pair<unsigned_long,_Mesh> *)in_stack_ffffffffffff7bc8._M_node);
    std::pair<unsigned_long,_Mesh>::~pair((pair<unsigned_long,_Mesh> *)0x150e77);
    Mesh::~Mesh((Mesh *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    local_440 = local_440 + 1;
  }
  pvVar2 = std::vector<tinygltf::Scene,_std::allocator<tinygltf::Scene>_>::operator[]
                     (avStack_308,(long)local_2d8);
  local_7ef8 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&pvVar2->nodes);
    if (sVar1 <= local_7ef8) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar2->nodes,local_7ef8);
    std::vector<tinygltf::Node,_std::allocator<tinygltf::Node>_>::operator[]
              (&local_398,(long)*pvVar3);
    std::vector<int,_std::allocator<int>_>::operator[](&pvVar2->nodes,local_7ef8);
    LoadglTFNode(in_stack_ffffffffffff7ed0,in_stack_ffffffffffff7ec8,in_stack_ffffffffffff7ec4,
                 in_stack_ffffffffffff7ec0,in_stack_ffffffffffff7eb8);
    local_7ef8 = local_7ef8 + 1;
  }
  local_7f00 = 0;
  while( true ) {
    sVar4 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::size
                      ((map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
                        *)0x151030);
    if (sVar4 <= local_7f00) break;
    pmVar5 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
             operator[]((map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
                         *)CONCAT17(in_stack_ffffffffffff7c07,in_stack_ffffffffffff7c00),
                        in_stack_ffffffffffff7bf8);
    if (-1 < pmVar5->mesh_id) {
      pmVar5 = std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::
               operator[]((map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>
                           *)CONCAT17(in_stack_ffffffffffff7c07,in_stack_ffffffffffff7c00),
                          in_stack_ffffffffffff7bf8);
      std::map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_>::operator[]
                ((map<int,_Node,_std::less<int>,_std::allocator<std::pair<const_int,_Node>_>_> *)
                 CONCAT17(in_stack_ffffffffffff7c07,in_stack_ffffffffffff7c00),
                 in_stack_ffffffffffff7bf8);
      pmVar6 = std::map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>::
               operator[]((map<int,_Mesh,_std::less<int>,_std::allocator<std::pair<const_int,_Mesh>_>_>
                           *)CONCAT17(in_stack_ffffffffffff7c07,in_stack_ffffffffffff7c00),
                          in_stack_ffffffffffff7bf8);
      memcpy(&pmVar6->matrix,&pmVar5->matrix,0x40);
    }
    local_7f00 = local_7f00 + 1;
  }
  uVar9 = 0;
  while( true ) {
    __n = uVar9;
    sVar1 = std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::size(local_380);
    if (sVar1 <= uVar9) break;
    std::vector<tinygltf::Texture,_std::allocator<tinygltf::Texture>_>::operator[](local_380,__n);
    LoadglTFTexture(in_stack_ffffffffffff7c08,
                    (Texture *)CONCAT17(in_stack_ffffffffffff7c07,in_stack_ffffffffffff7c00));
    std::make_pair<unsigned_long&,Texture>
              ((unsigned_long *)in_stack_ffffffffffff7bc8._M_node,
               (Texture *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    std::map<int,Texture,std::less<int>,std::allocator<std::pair<int_const,Texture>>>::
    insert<std::pair<unsigned_long,Texture>>
              ((map<int,_Texture,_std::less<int>,_std::allocator<std::pair<const_int,_Texture>_>_> *
               )in_stack_ffffffffffff7bd0,
               (pair<unsigned_long,_Texture> *)in_stack_ffffffffffff7bc8._M_node);
    std::pair<unsigned_long,_Texture>::~pair((pair<unsigned_long,_Texture> *)0x151255);
    Texture::~Texture((Texture *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    uVar9 = __n + 1;
  }
  local_8088 = 0;
  while( true ) {
    sVar1 = std::vector<tinygltf::Material,_std::allocator<tinygltf::Material>_>::size(&local_3c8);
    if (sVar1 <= local_8088) break;
    std::vector<tinygltf::Material,_std::allocator<tinygltf::Material>_>::operator[]
              (&local_3c8,local_8088);
    LoadglTFMaterial(in_stack_ffffffffffff8408,in_stack_ffffffffffff8400);
    std::make_pair<unsigned_long&,Material>
              ((unsigned_long *)in_stack_ffffffffffff7bc8._M_node,
               (Material *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    std::map<int,Material,std::less<int>,std::allocator<std::pair<int_const,Material>>>::
    insert<std::pair<unsigned_long,Material>>
              ((map<int,_Material,_std::less<int>,_std::allocator<std::pair<const_int,_Material>_>_>
                *)in_stack_ffffffffffff7bd0,
               (pair<unsigned_long,_Material> *)in_stack_ffffffffffff7bc8._M_node);
    std::pair<unsigned_long,_Material>::~pair((pair<unsigned_long,_Material> *)0x1513a2);
    Material::~Material((Material *)0x1513af);
    local_8088 = local_8088 + 1;
  }
  local_81a8 = 0;
  while( true ) {
    sVar1 = local_81a8;
    sVar7 = std::vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>::size(local_410);
    if (sVar7 <= sVar1) break;
    std::vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>::operator[]
              (local_410,local_81a8);
    LoadglTFAnimation(in_stack_ffffffffffff7ea8,in_stack_ffffffffffff7ea0);
    std::make_pair<unsigned_long&,Animation>
              ((unsigned_long *)in_stack_ffffffffffff7bc8._M_node,
               (Animation *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    std::map<int,Animation,std::less<int>,std::allocator<std::pair<int_const,Animation>>>::
    insert<std::pair<unsigned_long,Animation>>
              ((map<int,_Animation,_std::less<int>,_std::allocator<std::pair<const_int,_Animation>_>_>
                *)in_stack_ffffffffffff7bd0,
               (pair<unsigned_long,_Animation> *)in_stack_ffffffffffff7bc8._M_node);
    std::pair<unsigned_long,_Animation>::~pair((pair<unsigned_long,_Animation> *)0x1514ef);
    Animation::~Animation
              ((Animation *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    local_81a8 = local_81a8 + 1;
  }
  local_8278 = 0;
  while( true ) {
    sVar1 = std::vector<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>::size(local_350);
    if (sVar1 <= local_8278) break;
    this_00 = (map<int,_Skin,_std::less<int>,_std::allocator<std::pair<const_int,_Skin>_>_> *)
              (in_RDI + 0xa8);
    std::vector<tinygltf::Skin,_std::allocator<tinygltf::Skin>_>::operator[](local_350,local_8278);
    LoadglTFSkin(in_stack_ffffffffffff7d38,in_stack_ffffffffffff7d30);
    std::make_pair<unsigned_long&,Skin>
              ((unsigned_long *)in_stack_ffffffffffff7bc8._M_node,
               (Skin *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    _Var8 = std::map<int,Skin,std::less<int>,std::allocator<std::pair<int_const,Skin>>>::
            insert<std::pair<unsigned_long,Skin>>
                      (this_00,(pair<unsigned_long,_Skin> *)in_stack_ffffffffffff7bc8._M_node);
    in_stack_ffffffffffff7bc8 = _Var8.first._M_node;
    in_stack_ffffffffffff7bc7 = _Var8.second;
    std::pair<unsigned_long,_Skin>::~pair((pair<unsigned_long,_Skin> *)0x15163f);
    Skin::~Skin((Skin *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
    local_8278 = local_8278 + 1;
  }
  tinygltf::Model::~Model((Model *)CONCAT17(in_stack_ffffffffffff7bc7,in_stack_ffffffffffff7bc0));
  return;
}

Assistant:

void Model::LoadModel(const std::string &file) {
    tinygltf::Model gltf_model;
    LoadglTFModel(gltf_model, file);

    /* load the mesh data */
    for (std::size_t i = 0; i < gltf_model.meshes.size(); ++i) {
        meshes.insert(std::make_pair(i, LoadglTFMesh(gltf_model, gltf_model.meshes[i])));
    }

    /* load the node data                                */
    /* NOTE: only store node data from the default scene */
    const tinygltf::Scene &scene = gltf_model.scenes[gltf_model.defaultScene];
    for (std::size_t i = 0; i < scene.nodes.size(); ++i) {
        LoadglTFNode(gltf_model, gltf_model.nodes[scene.nodes[i]], -1, scene.nodes[i], nodes);
    }

    /* save the matrix information of the mesh */
    for (std::size_t i = 0; i < nodes.size(); ++i) {
        if (nodes[i].mesh_id > -1) {
            meshes[nodes[i].mesh_id].matrix = nodes[i].matrix;
        }
    }

    /* load the texture data */
    for (std::size_t i = 0; i < gltf_model.textures.size(); ++i) {
        textures.insert(std::make_pair(i, LoadglTFTexture(gltf_model, gltf_model.textures[i])));
    }

    /* load the material data */
    for (std::size_t i = 0; i < gltf_model.materials.size(); ++i) {
        materials.insert(std::make_pair(i, LoadglTFMaterial(gltf_model, gltf_model.materials[i])));
    }

    /* load the animation data */
    for (std::size_t i = 0; i < gltf_model.animations.size(); ++i) {
        animations.insert(std::make_pair(i, LoadglTFAnimation(gltf_model, gltf_model.animations[i])));
    }

    /* load the skin data */
    for (std::size_t i = 0; i < gltf_model.skins.size(); ++i) {
        skins.insert(std::make_pair(i, LoadglTFSkin(gltf_model, gltf_model.skins[i])));
    }
}